

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaValidatorPopElem(xmlSchemaValidCtxtPtr vctxt)

{
  byte *pbVar1;
  uint uVar2;
  xmlSchemaContentType xVar3;
  xmlSchemaNodeInfoPtr inode;
  xmlSchemaIDCPtr_conflict pxVar4;
  void **ppvVar5;
  long *plVar6;
  void *pvVar7;
  xmlSchemaPSVIIDCKeyPtr *ppxVar8;
  xmlSchemaPSVIIDCKeyPtr *ppxVar9;
  xmlSchemaPSVIIDCNodePtr pxVar10;
  xmlDoc *doc;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  xmlRegExecCtxtPtr pxVar18;
  xmlSchemaPSVIIDCBindingPtr_conflict pxVar19;
  undefined8 *puVar20;
  undefined8 *puVar21;
  xmlSchemaTypePtr pxVar22;
  xmlSchemaPSVIIDCBindingPtr_conflict *ppxVar23;
  xmlSchemaPSVIIDCBindingPtr_conflict pxVar24;
  xmlSchemaItemListPtr pxVar25;
  xmlSchemaPSVIIDCNodePtr *ppxVar26;
  xmlChar *pxVar27;
  xmlNodePtr cur;
  xmlSchemaIDCAugPtr_conflict aidc;
  xmlSchemaIDCAugPtr_conflict pxVar28;
  char *pcVar29;
  xmlSchemaIDCMatcherPtr_conflict pxVar30;
  long lVar31;
  long lVar32;
  xmlSchemaPSVIIDCBindingPtr_conflict pxVar33;
  xmlParserErrors error;
  xmlChar *in_R8;
  xmlChar *in_R9;
  uint uVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  uint uVar38;
  uint uVar39;
  ulong uVar40;
  ulong uVar41;
  bool bVar42;
  int terminal;
  int nbval;
  int nbneg;
  xmlChar *values [10];
  xmlChar *in_stack_fffffffffffffed8;
  xmlChar **in_stack_fffffffffffffee0;
  xmlSchemaPSVIIDCNodePtr local_100;
  xmlSchemaPSVIIDCNodePtr *local_f0;
  xmlHashTablePtr local_e8;
  void **local_e0;
  uint local_cc;
  xmlChar *local_b0;
  ulong local_a8;
  xmlChar *local_a0;
  uint local_94;
  long local_90;
  xmlChar *local_88 [11];
  
  inode = vctxt->inode;
  if (vctxt->nbAttrInfos != 0) {
    xmlSchemaClearAttrInfos(vctxt);
  }
  uVar2 = inode->flags;
  if ((uVar2 >> 9 & 1) != 0) {
    vctxt->skipDepth = vctxt->depth + -1;
LAB_001a76f3:
    iVar17 = 0;
    goto LAB_001a76fc;
  }
  pxVar22 = inode->typeDef;
  iVar17 = 0;
  if ((uVar2 >> 10 & 1) != 0 || pxVar22 == (xmlSchemaTypePtr)0x0) goto LAB_001a76fc;
  if ((pxVar22->contentType & ~XML_SCHEMA_CONTENT_EMPTY) == XML_SCHEMA_CONTENT_ELEMENTS) {
    if (pxVar22->builtInType == 0x2d) goto LAB_001a86d8;
    if ((uVar2 >> 8 & 1) != 0) goto LAB_001a86bc;
    local_a0 = (xmlChar *)CONCAT44(local_a0._4_4_,10);
    if (inode->regexCtxt != (xmlRegExecCtxtPtr)0x0) {
LAB_001a7652:
      iVar15 = (int)in_stack_fffffffffffffed8;
      iVar17 = (int)in_R9;
      if ((inode->flags & 4) == 0) {
        xmlRegExecNextValues
                  (inode->regexCtxt,(int *)&local_a0,(int *)&local_94,local_88,(int *)&local_b0);
        lVar32 = 0;
        iVar14 = xmlRegExecPushString(inode->regexCtxt,(xmlChar *)0x0,(void *)0x0);
        if ((iVar14 < 0) || ((iVar14 == 0 && ((inode->flags & 4) == 0)))) {
          pbVar1 = (byte *)((long)&inode->flags + 1);
          *pbVar1 = *pbVar1 | 1;
          xmlSchemaComplexTypeErr
                    ((xmlSchemaAbstractCtxtPtr)vctxt,0x1e7d6d,
                     (xmlNodePtr)((ulong)local_a0 & 0xffffffff),(xmlSchemaTypePtr)(ulong)local_94,
                     (char *)local_88,iVar17,iVar15,in_stack_fffffffffffffee0);
        }
      }
      else {
        lVar32 = 5;
      }
      iVar17 = (*(code *)((long)&DAT_001e1ef4 + (long)(int)(&DAT_001e1ef4)[lVar32]))();
      return iVar17;
    }
    pxVar18 = xmlRegNewExecCtxt(inode->typeDef->contModel,xmlSchemaVContentModelCallback,vctxt);
    inode->regexCtxt = pxVar18;
    if (pxVar18 != (xmlRegExecCtxtPtr)0x0) goto LAB_001a7652;
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidatorPopElem",
               "failed to create a regex context",(xmlChar *)0x0,in_R8);
LAB_001a888c:
    vctxt->err = -1;
    iVar17 = -1;
  }
  else {
LAB_001a86bc:
    iVar17 = 0;
    if (inode->typeDef->contentType == XML_SCHEMA_CONTENT_ELEMENTS) goto LAB_001a76fc;
LAB_001a86d8:
    iVar17 = 0;
    if (vctxt->value != (xmlSchemaValPtr)0x0) {
      xmlSchemaFreeValue(vctxt->value);
      vctxt->value = (xmlSchemaValPtr)0x0;
    }
    if (inode->decl == (xmlSchemaElementPtr)0x0) {
      pxVar22 = inode->typeDef;
      if ((pxVar22->type != XML_SCHEMA_TYPE_SIMPLE) &&
         ((pxVar22->type != XML_SCHEMA_TYPE_BASIC || (pxVar22->builtInType == 0x2d)))) {
        iVar17 = 0;
        if ((pxVar22->contentType | XML_SCHEMA_CONTENT_ELEMENTS) != XML_SCHEMA_CONTENT_BASIC)
        goto joined_r0x001a886c;
        pxVar22 = pxVar22->contentTypeDef;
      }
      iVar17 = xmlSchemaVCheckINodeDataType(vctxt,inode,pxVar22,inode->value);
joined_r0x001a886c:
      if (iVar17 < 0) {
        pcVar29 = "calling xmlSchemaVCheckCVCSimpleType()";
LAB_001a8880:
        xmlSchemaInternalErr2
                  ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidatorPopElem",pcVar29,
                   (xmlChar *)0x0,in_R8);
        goto LAB_001a888c;
      }
    }
    else {
      pxVar27 = inode->decl->value;
      if ((pxVar27 == (xmlChar *)0x0) || ((inode->flags & 0x24U) != 0x20)) {
        if ((inode->flags & 4) != 0) goto LAB_001a76fc;
        pxVar22 = inode->typeDef;
        if ((pxVar22->type == XML_SCHEMA_TYPE_SIMPLE) ||
           ((pxVar22->type == XML_SCHEMA_TYPE_BASIC && (pxVar22->builtInType != 0x2d)))) {
LAB_001a8802:
          iVar17 = xmlSchemaVCheckINodeDataType(vctxt,inode,pxVar22,inode->value);
        }
        else {
          iVar17 = 0;
          if ((pxVar22->contentType | XML_SCHEMA_CONTENT_ELEMENTS) == XML_SCHEMA_CONTENT_BASIC) {
            pxVar22 = pxVar22->contentTypeDef;
            goto LAB_001a8802;
          }
        }
        if (iVar17 != 0) goto joined_r0x001a886c;
        pxVar27 = inode->decl->value;
        iVar17 = 0;
        if ((pxVar27 == (xmlChar *)0x0) || ((inode->decl->flags & 8) == 0)) goto LAB_001a76fc;
        if ((inode->flags & 0x80) == 0) {
          xVar3 = inode->typeDef->contentType;
          if ((xVar3 == XML_SCHEMA_CONTENT_BASIC) || (xVar3 == XML_SCHEMA_CONTENT_SIMPLE)) {
            iVar15 = xmlStrEqual(inode->value,pxVar27);
            if (iVar15 == 0) {
              in_R9 = inode->value;
              in_stack_fffffffffffffed8 = inode->decl->value;
              pcVar29 = "The actual value \'%s\' does not match the fixed value constraint \'%s\'";
              iVar17 = 0x742;
              error = XML_SCHEMAV_CVC_ELT_5_2_2_2_2;
              goto LAB_001a8b5d;
            }
          }
          else if ((xVar3 == XML_SCHEMA_CONTENT_MIXED) &&
                  (iVar15 = xmlStrEqual(inode->value,pxVar27), iVar15 == 0)) {
            in_R9 = inode->value;
            in_stack_fffffffffffffed8 = inode->decl->value;
            pcVar29 = "The initial value \'%s\' does not match the fixed value constraint \'%s\'";
            iVar17 = 0x741;
            error = XML_SCHEMAV_CVC_ELT_5_2_2_2_1;
            goto LAB_001a8b5d;
          }
        }
        else {
          in_stack_fffffffffffffed8 = (xmlChar *)0x0;
          pcVar29 = 
          "The content must not contain element nodes since there is a fixed value constraint";
          iVar17 = 0x740;
          error = XML_SCHEMAV_CVC_ELT_5_2_2_1;
          in_R9 = (xmlChar *)0x0;
LAB_001a8b5d:
          xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,error,(xmlNodePtr)0x0,
                              (xmlSchemaBasicItemPtr)0x0,pcVar29,in_R9,in_stack_fffffffffffffed8,
                              (xmlChar *)0x0,(xmlChar *)0x0);
        }
      }
      else {
        if ((inode->flags & 8U) == 0) {
          pxVar22 = inode->typeDef;
          if ((pxVar22->type == XML_SCHEMA_TYPE_SIMPLE) ||
             ((pxVar22->type == XML_SCHEMA_TYPE_BASIC && (pxVar22->builtInType != 0x2d)))) {
LAB_001a8764:
            iVar17 = xmlSchemaVCheckINodeDataType(vctxt,inode,pxVar22,pxVar27);
          }
          else {
            iVar17 = 0;
            if ((pxVar22->contentType | XML_SCHEMA_CONTENT_ELEMENTS) == XML_SCHEMA_CONTENT_BASIC) {
              pxVar22 = pxVar22->contentTypeDef;
              goto LAB_001a8764;
            }
          }
          if (iVar17 != 0) goto joined_r0x001a886c;
        }
        else {
          iVar17 = xmlSchemaCheckCOSValidDefault(vctxt,pxVar27,&inode->val);
          if (iVar17 != 0) {
            if (-1 < iVar17) goto LAB_001a76fc;
            pcVar29 = "calling xmlSchemaCheckCOSValidDefault()";
            goto LAB_001a8880;
          }
        }
        if ((vctxt->options & 1) == 0) goto LAB_001a76f3;
        iVar17 = 0;
        if (inode->node != (xmlNodePtr)0x0) {
          pxVar27 = xmlSchemaNormalizeValue(inode->typeDef,inode->decl->value);
          doc = inode->node->doc;
          if (pxVar27 == (xmlChar *)0x0) {
            cur = xmlNewDocText(doc,inode->decl->value);
          }
          else {
            cur = xmlNewDocText(doc,pxVar27);
            (*xmlFree)(pxVar27);
          }
          if (cur == (xmlNodePtr)0x0) {
            xmlSchemaInternalErr2
                      ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidatorPopElem",
                       "calling xmlNewDocText()",(xmlChar *)0x0,in_R8);
            goto LAB_001a888c;
          }
          xmlAddChild(inode->node,cur);
        }
      }
    }
LAB_001a76fc:
    iVar15 = vctxt->depth;
    if (-1 < iVar15) {
      if (iVar15 == vctxt->skipDepth) {
        vctxt->skipDepth = -1;
      }
      if ((inode->appliedXPath != 0) &&
         (iVar15 = xmlSchemaXPathProcessHistory(vctxt,iVar15), iVar15 == -1)) goto LAB_001a888c;
      pxVar30 = inode->idcMatchers;
      if ((pxVar30 != (xmlSchemaIDCMatcherPtr_conflict)0x0) &&
         ((vctxt->hasKeyrefs != 0 || (vctxt->createIDCNodeTables != 0)))) {
        do {
          pxVar4 = pxVar30->aidc->def;
          if ((pxVar4->type != XML_SCHEMA_TYPE_IDC_KEYREF) &&
             (((pxVar30->targets != (xmlSchemaItemListPtr)0x0 && (pxVar30->targets->nbItems != 0))
              && ((vctxt->createIDCNodeTables != 0 ||
                  ((iVar15 = pxVar30->aidc->keyrefDepth, iVar15 != -1 && (iVar15 <= vctxt->depth))))
                 )))) {
            pxVar33 = vctxt->elemInfos[pxVar30->depth]->idcTable;
            if (pxVar33 == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
              pxVar24 = (xmlSchemaPSVIIDCBindingPtr_conflict)
                        &vctxt->elemInfos[pxVar30->depth]->idcTable;
            }
            else {
              do {
                pxVar19 = pxVar33;
                if (pxVar19->definition == pxVar4) goto LAB_001a77f9;
                pxVar33 = pxVar19->next;
                pxVar24 = pxVar19;
              } while (pxVar19->next != (xmlSchemaPSVIIDCBindingPtr)0x0);
            }
            pxVar19 = xmlSchemaIDCNewBinding(pxVar4);
            pxVar24->next = pxVar19;
LAB_001a77f9:
            if (pxVar19 == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) goto LAB_001a888c;
            pxVar25 = pxVar19->dupls;
            if ((pxVar25 == (xmlSchemaItemListPtr)0x0) ||
               (uVar40 = (ulong)(uint)pxVar25->nbItems, pxVar25->nbItems == 0)) {
              uVar40 = 0;
              local_100 = (xmlSchemaPSVIIDCNodePtr)0x0;
            }
            else {
              local_100 = (xmlSchemaPSVIIDCNodePtr)pxVar25->items;
            }
            ppxVar26 = pxVar19->nodeTable;
            if (ppxVar26 == (xmlSchemaPSVIIDCNodePtr *)0x0) {
              bVar42 = true;
            }
            else {
              bVar42 = pxVar19->nbNodes == 0;
            }
            if (((int)uVar40 == 0) && (bVar42)) {
              if (ppxVar26 != (xmlSchemaPSVIIDCNodePtr *)0x0) {
                (*xmlFree)(ppxVar26);
              }
              pxVar25 = pxVar30->targets;
              pxVar19->nodeTable = (xmlSchemaPSVIIDCNodePtr *)pxVar25->items;
              pxVar19->sizeNodes = pxVar25->sizeItems;
              pxVar19->nbNodes = pxVar25->nbItems;
              pxVar25->items = (void **)0x0;
              pxVar25->nbItems = 0;
              pxVar25->sizeItems = 0;
              if (pxVar30->htab != (xmlHashTablePtr)0x0) {
                xmlHashFree(pxVar30->htab,xmlFreeIDCHashEntry);
                pxVar30->htab = (xmlHashTablePtr)0x0;
              }
            }
            else {
              uVar2 = pxVar30->targets->nbItems;
              ppvVar5 = pxVar30->targets->items;
              uVar39 = pxVar30->aidc->def->nbFields;
              uVar37 = 1;
              if (1 < (int)uVar40) {
                uVar37 = uVar40;
              }
              if ((int)uVar2 < 2) {
                uVar2 = 1;
              }
              uVar41 = 0;
              local_a8 = uVar40;
              do {
                plVar6 = *(long **)((long)ppvVar5[uVar41] + 8);
                if ((int)local_a8 != 0) {
                  uVar40 = 0;
                  do {
                    if (uVar39 == 1) {
                      iVar15 = xmlSchemaAreValuesEqual
                                         (*(xmlSchemaValPtr *)(*plVar6 + 8),
                                          *(xmlSchemaValPtr *)
                                           (**(long **)((long)*(void **)((long)local_100 +
                                                                        uVar40 * 8) + 8) + 8));
                      if (iVar15 == -1) goto LAB_001a888c;
                      if (iVar15 == 1) goto LAB_001a7b4e;
                    }
                    else if (0 < (int)uVar39) {
                      lVar32 = *(long *)((long)*(void **)((long)local_100 + uVar40 * 8) + 8);
                      uVar35 = 0;
                      while( true ) {
                        iVar15 = xmlSchemaAreValuesEqual
                                           (*(xmlSchemaValPtr *)(plVar6[uVar35] + 8),
                                            *(xmlSchemaValPtr *)(*(long *)(lVar32 + uVar35 * 8) + 8)
                                           );
                        if (iVar15 == -1) goto LAB_001a888c;
                        if (iVar15 == 0) break;
                        uVar35 = uVar35 + 1;
                        if (uVar39 == uVar35) goto LAB_001a7b4e;
                      }
                    }
                    uVar40 = uVar40 + 1;
                  } while (uVar40 != uVar37);
                }
                if (pxVar19->nbNodes != 0) {
                  uVar40 = 0;
                  do {
                    if (uVar39 == 1) {
                      iVar15 = xmlSchemaAreValuesEqual
                                         (*(xmlSchemaValPtr *)(*plVar6 + 8),
                                          (*pxVar19->nodeTable[uVar40]->keys)->val);
                      if (iVar15 == 0) goto LAB_001a79d6;
                      if (iVar15 == -1) goto LAB_001a888c;
LAB_001a7a2c:
                      if (pxVar19->dupls == (xmlSchemaItemListPtr)0x0) {
                        pxVar25 = xmlSchemaItemListCreate();
                        pxVar19->dupls = pxVar25;
                        if (pxVar25 == (xmlSchemaItemListPtr)0x0) goto LAB_001a888c;
                      }
                      iVar15 = xmlSchemaItemListAddSize
                                         (pxVar19->dupls,0x14,
                                          pxVar19->nodeTable[uVar40 & 0xffffffff]);
                      if (iVar15 == -1) goto LAB_001a888c;
                      local_100 = (xmlSchemaPSVIIDCNodePtr)pxVar19->dupls->items;
                      iVar15 = pxVar19->nbNodes;
                      pxVar19->nodeTable[uVar40 & 0xffffffff] =
                           pxVar19->nodeTable[(long)iVar15 + -1];
                      pxVar19->nbNodes = iVar15 + -1;
                      goto LAB_001a7b4e;
                    }
                    if ((int)uVar39 < 1) goto LAB_001a7a2c;
                    ppxVar8 = pxVar19->nodeTable[uVar40]->keys;
                    uVar35 = 0;
                    while( true ) {
                      iVar15 = xmlSchemaAreValuesEqual
                                         (*(xmlSchemaValPtr *)(plVar6[uVar35] + 8),
                                          ppxVar8[uVar35]->val);
                      if (iVar15 == -1) goto LAB_001a888c;
                      if (iVar15 == 0) break;
                      uVar35 = uVar35 + 1;
                      if (uVar39 == uVar35) goto LAB_001a7a2c;
                    }
LAB_001a79d6:
                    uVar40 = uVar40 + 1;
                  } while ((long)uVar40 < (long)pxVar19->nbNodes);
                }
                pxVar10 = (xmlSchemaPSVIIDCNodePtr)ppvVar5[uVar41];
                iVar15 = pxVar19->sizeNodes;
                if (iVar15 <= pxVar19->nbNodes) {
                  if (iVar15 < 1) {
                    uVar40 = 10;
                  }
                  else {
                    uVar40 = 0xffffffff;
                    if (iVar15 < 1000000000) {
                      uVar34 = iVar15 + 1U >> 1;
                      uVar38 = uVar34 + iVar15;
                      if ((int)(1000000000 - uVar34) < iVar15) {
                        uVar38 = 1000000000;
                      }
                      uVar40 = (ulong)uVar38;
                    }
                  }
                  if (((int)uVar40 < 0) ||
                     (ppxVar26 = (xmlSchemaPSVIIDCNodePtr *)
                                 (*xmlRealloc)(pxVar19->nodeTable,uVar40 << 3),
                     ppxVar26 == (xmlSchemaPSVIIDCNodePtr *)0x0)) {
                    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,
                                        (void *)0x0,0x11,(xmlError *)0x0);
                    goto LAB_001a888c;
                  }
                  pxVar19->nodeTable = ppxVar26;
                  pxVar19->sizeNodes = (int)uVar40;
                }
                iVar15 = pxVar19->nbNodes;
                pxVar19->nbNodes = iVar15 + 1;
                pxVar19->nodeTable[iVar15] = pxVar10;
LAB_001a7b4e:
                uVar41 = uVar41 + 1;
              } while (uVar41 != uVar2);
            }
          }
          pxVar30 = pxVar30->next;
        } while (pxVar30 != (xmlSchemaIDCMatcherPtr)0x0);
      }
      if (vctxt->inode->hasKeyrefs != 0) {
        for (pxVar30 = vctxt->inode->idcMatchers; pxVar30 != (xmlSchemaIDCMatcherPtr_conflict)0x0;
            pxVar30 = pxVar30->next) {
          if (((pxVar30->idcType == 0x18) && (pxVar30->targets != (xmlSchemaItemListPtr)0x0)) &&
             (pxVar30->targets->nbItems != 0)) {
            pxVar4 = pxVar30->aidc->def;
            uVar2 = pxVar4->nbFields;
            pxVar33 = (xmlSchemaPSVIIDCBindingPtr_conflict)&vctxt->inode->idcTable;
            do {
              pxVar33 = pxVar33->next;
              if (pxVar33 == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) goto LAB_001a7c04;
            } while ((xmlSchemaIDCPtr_conflict)pxVar4->ref->item != pxVar33->definition);
            if (pxVar33->dupls == (xmlSchemaItemListPtr)0x0) {
LAB_001a7c04:
              bVar42 = false;
            }
            else {
              bVar42 = pxVar33->dupls->nbItems != 0;
            }
            if (pxVar33 == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
              local_e8 = (xmlHashTablePtr)0x0;
            }
            else {
              local_e8 = xmlHashCreate(pxVar33->nbNodes * 2);
              if (0 < pxVar33->nbNodes) {
                lVar32 = 0;
                do {
                  xmlSchemaFormatIDCKeySequence_1
                            (vctxt,local_88,pxVar33->nodeTable[lVar32]->keys,uVar2,1);
                  puVar20 = (undefined8 *)(*xmlMalloc)(0x10);
                  pxVar27 = local_88[0];
                  if (puVar20 == (undefined8 *)0x0) {
                    xmlSchemaVErrMemory(vctxt);
                  }
                  else {
                    *(int *)(puVar20 + 1) = (int)lVar32;
                    puVar21 = (undefined8 *)xmlHashLookup(local_e8,local_88[0]);
                    if (puVar21 == (undefined8 *)0x0) {
                      *puVar20 = 0;
                      iVar15 = xmlHashAddEntry(local_e8,pxVar27,puVar20);
                      if (iVar15 < 0) {
                        xmlSchemaVErrMemory(vctxt);
                        (*xmlFree)(puVar20);
                      }
                    }
                    else {
                      *puVar20 = *puVar21;
                      *puVar21 = puVar20;
                    }
                  }
                  if (local_88[0] != (xmlChar *)0x0) {
                    (*xmlFree)(local_88[0]);
                    local_88[0] = (xmlChar *)0x0;
                  }
                  lVar32 = lVar32 + 1;
                } while (lVar32 < pxVar33->nbNodes);
              }
            }
            pxVar25 = pxVar30->targets;
            bVar11 = 0 < pxVar25->nbItems;
            if (0 < pxVar25->nbItems) {
              bVar11 = true;
              lVar32 = 0;
LAB_001a7d3b:
              pvVar7 = pxVar25->items[lVar32];
              if (pxVar33 != (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
                ppxVar8 = *(xmlSchemaPSVIIDCKeyPtr **)((long)pvVar7 + 8);
                xmlSchemaFormatIDCKeySequence_1(vctxt,local_88,ppxVar8,uVar2,1);
                pxVar27 = local_88[0];
                puVar20 = (undefined8 *)xmlHashLookup(local_e8,local_88[0]);
                if (pxVar27 != (xmlChar *)0x0) {
                  (*xmlFree)(pxVar27);
                  local_88[0] = (xmlChar *)0x0;
                }
                local_a8 = local_a8 & 0xffffffff00000000;
                for (; bVar13 = bVar42, puVar20 != (undefined8 *)0x0;
                    puVar20 = (undefined8 *)*puVar20) {
                  if (0 < (int)uVar2) {
                    ppxVar9 = pxVar33->nodeTable[*(int *)(puVar20 + 1)]->keys;
                    uVar40 = 0;
                    do {
                      iVar15 = xmlSchemaAreValuesEqual(ppxVar9[uVar40]->val,ppxVar8[uVar40]->val);
                      if (iVar15 == -1) goto LAB_001a7ea6;
                      if (iVar15 == 0) goto LAB_001a7e08;
                      uVar40 = uVar40 + 1;
                    } while (uVar2 != uVar40);
                    if (iVar15 == 1) {
                      local_a8 = CONCAT44(local_a8._4_4_,1);
                      bVar13 = false;
                      break;
                    }
                  }
LAB_001a7e08:
                }
                bVar12 = true;
                if (bVar13) {
                  pxVar25 = pxVar33->dupls;
                  if (pxVar25->nbItems < 1) {
                    iVar15 = 0;
                  }
                  else {
                    lVar31 = 0;
                    do {
                      if (0 < (int)uVar2) {
                        lVar36 = *(long *)((long)pxVar25->items[lVar31] + 8);
                        uVar40 = 0;
                        do {
                          iVar15 = xmlSchemaAreValuesEqual
                                             (*(xmlSchemaValPtr *)
                                               (*(long *)(lVar36 + uVar40 * 8) + 8),
                                              ppxVar8[uVar40]->val);
                          if (iVar15 == -1) goto LAB_001a7ea6;
                          if (iVar15 == 0) goto LAB_001a7e81;
                          uVar40 = uVar40 + 1;
                        } while (uVar2 != uVar40);
                        if (iVar15 == 1) {
                          local_b0 = (xmlChar *)0x0;
                          local_a0 = (xmlChar *)0x0;
                          pxVar22 = (xmlSchemaTypePtr)
                                    xmlSchemaFormatIDCKeySequence_1
                                              (vctxt,&local_b0,
                                               *(xmlSchemaPSVIIDCKeyPtr **)((long)pvVar7 + 8),uVar2,
                                               0);
                          pxVar27 = xmlSchemaGetComponentQName(&local_a0,pxVar30->aidc->def);
                          xmlSchemaKeyrefErr(vctxt,(xmlParserErrors)pvVar7,
                                             (xmlSchemaPSVIIDCNodePtr)
                                             "More than one match found for key-sequence %s of keyref \'%s\'"
                                             ,pxVar22,(char *)pxVar27,in_R9,
                                             in_stack_fffffffffffffed8);
                          if (local_b0 != (xmlChar *)0x0) {
                            (*xmlFree)(local_b0);
                            local_b0 = (xmlChar *)0x0;
                          }
                          bVar12 = true;
                          if (local_a0 != (xmlChar *)0x0) {
                            (*xmlFree)(local_a0);
                            local_a0 = (xmlChar *)0x0;
                          }
                          iVar15 = 1;
                          goto LAB_001a7ed8;
                        }
                      }
LAB_001a7e81:
                      lVar31 = lVar31 + 1;
                      pxVar25 = pxVar33->dupls;
                    } while (lVar31 < pxVar25->nbItems);
                    bVar12 = true;
                    iVar15 = 0;
                  }
                }
                else {
                  iVar15 = (int)local_a8;
                }
                goto LAB_001a7ed8;
              }
              iVar15 = 0;
              goto LAB_001a7ee0;
            }
LAB_001a8073:
            if (local_e8 != (xmlHashTablePtr)0x0) {
              xmlHashFree(local_e8,xmlFreeIDCHashEntry);
            }
LAB_001a8089:
            if (bVar11) goto LAB_001a888c;
          }
        }
      }
      if ((((inode->idcTable != (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) &&
           (0 < (long)vctxt->depth)) &&
          ((vctxt->hasKeyrefs != 0 || (vctxt->createIDCNodeTables != 0)))) &&
         (pxVar33 = vctxt->inode->idcTable, pxVar33 != (xmlSchemaPSVIIDCBindingPtr_conflict)0x0)) {
        ppxVar23 = &vctxt->elemInfos[(long)vctxt->depth + -1]->idcTable;
        iVar15 = 0;
        local_100 = (xmlSchemaPSVIIDCNodePtr)0x0;
        do {
          if ((pxVar33->nbNodes != 0) ||
             ((pxVar33->dupls != (xmlSchemaItemListPtr)0x0 && (pxVar33->dupls->nbItems != 0)))) {
            pxVar24 = (xmlSchemaPSVIIDCBindingPtr_conflict)ppxVar23;
            if (vctxt->createIDCNodeTables == 0) {
              pxVar28 = vctxt->aidcs;
              do {
                if (pxVar28->def == pxVar33->definition) {
                  if ((pxVar28->keyrefDepth == -1) || (vctxt->depth <= pxVar28->keyrefDepth))
                  goto LAB_001a8675;
                  break;
                }
                pxVar28 = pxVar28->next;
              } while (pxVar28 != (xmlSchemaIDCAugPtr)0x0);
            }
            do {
              pxVar24 = pxVar24->next;
              if (pxVar24 == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
                pxVar24 = xmlSchemaIDCNewBinding(pxVar33->definition);
                if (pxVar24 == (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) goto LAB_001a888c;
                iVar14 = pxVar33->nbNodes;
                if ((long)iVar14 != 0) {
                  if (vctxt->psviExposeIDCNodeTables == 0) {
                    pxVar24->nodeTable = pxVar33->nodeTable;
                    pxVar33->nodeTable = (xmlSchemaPSVIIDCNodePtr *)0x0;
                    pxVar24->sizeNodes = pxVar33->sizeNodes;
                    pxVar33->sizeNodes = 0;
                    pxVar24->nbNodes = iVar14;
                    pxVar33->nbNodes = 0;
                  }
                  else {
                    ppxVar26 = (xmlSchemaPSVIIDCNodePtr *)(*xmlMalloc)((long)iVar14 << 3);
                    pxVar24->nodeTable = ppxVar26;
                    if (ppxVar26 == (xmlSchemaPSVIIDCNodePtr *)0x0) {
                      xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,
                                          (void *)0x0,0x11,(xmlError *)0x0);
                      xmlSchemaIDCFreeBinding(pxVar24);
                      goto LAB_001a888c;
                    }
                    iVar14 = pxVar33->nbNodes;
                    pxVar24->sizeNodes = iVar14;
                    pxVar24->nbNodes = iVar14;
                    memcpy(ppxVar26,pxVar33->nodeTable,(long)pxVar33->nbNodes << 3);
                  }
                }
                if (pxVar33->dupls != (xmlSchemaItemListPtr)0x0) {
                  pxVar25 = pxVar24->dupls;
                  if (pxVar25 != (xmlSchemaItemListPtr)0x0) {
                    if (pxVar25->items != (void **)0x0) {
                      (*xmlFree)(pxVar25->items);
                    }
                    (*xmlFree)(pxVar25);
                  }
                  pxVar24->dupls = pxVar33->dupls;
                  pxVar33->dupls = (xmlSchemaItemListPtr)0x0;
                }
                if (*ppxVar23 != (xmlSchemaPSVIIDCBindingPtr)0x0) {
                  pxVar24->next = *ppxVar23;
                }
                *ppxVar23 = pxVar24;
                goto LAB_001a8675;
              }
            } while (pxVar24->definition != pxVar33->definition);
            pxVar25 = pxVar24->dupls;
            if ((pxVar25 == (xmlSchemaItemListPtr)0x0) || (iVar14 = pxVar25->nbItems, iVar14 == 0))
            {
              local_e0 = (void **)0x0;
              iVar14 = 0;
            }
            else {
              local_e0 = pxVar25->items;
            }
            if (0 < pxVar33->nbNodes) {
              local_cc = pxVar24->nbNodes;
              uVar2 = pxVar33->definition->nbFields;
              local_f0 = pxVar24->nodeTable;
              local_90 = (long)iVar14;
              lVar32 = 0;
              do {
                pxVar10 = pxVar33->nodeTable[lVar32];
                if (pxVar10 != (xmlSchemaPSVIIDCNodePtr)0x0) {
                  if (iVar14 == 0) {
                    if (local_cc != 0) goto LAB_001a83c5;
                    local_cc = 0;
                  }
                  else {
                    if (iVar14 < 1) {
                      iVar16 = 0;
                    }
                    else {
                      iVar16 = 0;
                      do {
                        lVar31 = local_90;
                        lVar36 = (long)iVar16;
                        if (uVar2 == 1) {
                          while (iVar15 = xmlSchemaAreValuesEqual
                                                    ((*pxVar10->keys)->val,
                                                     *(xmlSchemaValPtr *)
                                                      (**(long **)((long)local_e0[lVar36] + 8) + 8))
                                , iVar15 == 0) {
                            lVar36 = lVar36 + 1;
                            if (lVar31 <= lVar36) {
                              iVar15 = 0;
                              iVar16 = (int)lVar36;
                              goto LAB_001a83a6;
                            }
                          }
                          if (iVar15 == -1) goto LAB_001a888c;
                          iVar15 = 1;
                          iVar16 = (int)lVar36;
                        }
                        else {
                          local_100 = (xmlSchemaPSVIIDCNodePtr)local_e0[lVar36];
                          if (0 < (int)uVar2) {
                            uVar40 = 0;
                            do {
                              iVar15 = xmlSchemaAreValuesEqual
                                                 (pxVar10->keys[uVar40]->val,
                                                  local_100->keys[uVar40]->val);
                              if (iVar15 == -1) goto LAB_001a888c;
                            } while ((iVar15 != 0) && (uVar40 = uVar40 + 1, uVar2 != uVar40));
                          }
                        }
                        if (iVar15 == 1) {
                          iVar15 = 1;
                          break;
                        }
                        iVar16 = iVar16 + 1;
                      } while (iVar16 < iVar14);
                    }
LAB_001a83a6:
                    if ((iVar16 == iVar14) && (local_cc != 0)) {
LAB_001a83c5:
                      if ((int)local_cc < 1) {
                        uVar40 = 0;
                      }
                      else {
                        local_a8 = (ulong)local_cc;
                        uVar40 = 0;
                        do {
                          local_100 = local_f0[uVar40];
                          if (uVar2 == 1) {
                            iVar15 = xmlSchemaAreValuesEqual
                                               ((*pxVar10->keys)->val,(*local_100->keys)->val);
                            if (iVar15 != 0) {
                              bVar42 = iVar15 != -1;
                              iVar15 = 1;
                              if (bVar42) goto LAB_001a846e;
                              goto LAB_001a888c;
                            }
                          }
                          else {
                            if (0 < (int)uVar2) {
                              uVar37 = 0;
                              do {
                                iVar15 = xmlSchemaAreValuesEqual
                                                   (pxVar10->keys[uVar37]->val,
                                                    local_100->keys[uVar37]->val);
                                if (iVar15 == -1) goto LAB_001a888c;
                                if (iVar15 == 0) goto LAB_001a846e;
                                uVar37 = uVar37 + 1;
                              } while (uVar2 != uVar37);
                              iVar15 = 1;
                            }
LAB_001a846e:
                            if (iVar15 == 1) {
                              iVar15 = 1;
                              goto LAB_001a8494;
                            }
                          }
                          uVar40 = uVar40 + 1;
                        } while (uVar40 != local_a8);
                        uVar40 = (ulong)local_cc;
                      }
LAB_001a8494:
                      if ((uint)uVar40 == local_cc) {
                        iVar16 = pxVar24->sizeNodes;
                        if (iVar16 <= pxVar24->nbNodes) {
                          if (iVar16 < 1) {
                            uVar39 = 10;
                          }
                          else {
                            uVar39 = 0xffffffff;
                            if (iVar16 < 1000000000) {
                              uVar38 = iVar16 + 1U >> 1;
                              uVar39 = uVar38 + iVar16;
                              if ((int)(1000000000 - uVar38) < iVar16) {
                                uVar39 = 1000000000;
                              }
                            }
                          }
                          if (((int)uVar39 < 0) ||
                             (ppxVar26 = (xmlSchemaPSVIIDCNodePtr *)
                                         (*xmlRealloc)(pxVar24->nodeTable,(ulong)uVar39 << 3),
                             ppxVar26 == (xmlSchemaPSVIIDCNodePtr *)0x0)) {
                            xmlSchemaVErrMemory(vctxt);
                            goto LAB_001a888c;
                          }
                          pxVar24->nodeTable = ppxVar26;
                          pxVar24->sizeNodes = uVar39;
                        }
                        local_f0 = pxVar24->nodeTable;
                        iVar16 = pxVar24->nbNodes;
                        pxVar24->nbNodes = iVar16 + 1;
                        local_f0[iVar16] = pxVar10;
                      }
                      else {
                        uVar39 = pxVar24->nbNodes;
                        pxVar24->nbNodes = uVar39 - 1;
                        local_f0[(int)(uint)uVar40] = local_f0[(long)(int)local_cc + -1];
                        if (uVar39 != local_cc) {
                          local_f0[(long)(int)local_cc + -1] = local_f0[(long)(int)uVar39 + -1];
                        }
                        if (pxVar24->dupls == (xmlSchemaItemListPtr)0x0) {
                          pxVar25 = xmlSchemaItemListCreate();
                          pxVar24->dupls = pxVar25;
                          if (pxVar25 == (xmlSchemaItemListPtr)0x0) goto LAB_001a888c;
                        }
                        local_cc = local_cc - 1;
                        xmlSchemaItemListAddSize(pxVar24->dupls,0x14,local_100);
                        local_e0 = pxVar24->dupls->items;
                      }
                    }
                  }
                }
                lVar32 = lVar32 + 1;
              } while (lVar32 < pxVar33->nbNodes);
            }
          }
LAB_001a8675:
          pxVar33 = pxVar33->next;
        } while (pxVar33 != (xmlSchemaPSVIIDCBindingPtr)0x0);
      }
      xmlSchemaClearElemInfo(vctxt,inode);
      iVar15 = vctxt->depth;
      if ((long)iVar15 != 0) {
        for (pxVar28 = vctxt->aidcs; pxVar28 != (xmlSchemaIDCAugPtr_conflict)0x0;
            pxVar28 = pxVar28->next) {
          if (pxVar28->keyrefDepth == iVar15) {
            pxVar28->keyrefDepth = -1;
          }
        }
        vctxt->depth = iVar15 + -1;
        vctxt->inode = vctxt->elemInfos[(long)iVar15 + -1];
        return iVar17;
      }
      vctxt->depth = -1;
      vctxt->inode = (xmlSchemaNodeInfoPtr)0x0;
    }
    iVar17 = 0;
  }
  return iVar17;
LAB_001a7ea6:
  bVar12 = false;
LAB_001a7ed8:
  if (!bVar12) goto LAB_001a8089;
LAB_001a7ee0:
  if (iVar15 == 0) {
    local_88[0] = (xmlChar *)0x0;
    local_b0 = (xmlChar *)0x0;
    pxVar22 = (xmlSchemaTypePtr)
              xmlSchemaFormatIDCKeySequence_1
                        (vctxt,local_88,*(xmlSchemaPSVIIDCKeyPtr **)((long)pvVar7 + 8),uVar2,0);
    pxVar27 = xmlSchemaGetComponentQName(&local_b0,pxVar30->aidc->def);
    xmlSchemaKeyrefErr(vctxt,(xmlParserErrors)pvVar7,
                       (xmlSchemaPSVIIDCNodePtr)
                       "No match found for key-sequence %s of keyref \'%s\'",pxVar22,(char *)pxVar27
                       ,in_R9,in_stack_fffffffffffffed8);
    if (local_88[0] != (xmlChar *)0x0) {
      (*xmlFree)(local_88[0]);
      local_88[0] = (xmlChar *)0x0;
    }
    if (local_b0 != (xmlChar *)0x0) {
      (*xmlFree)(local_b0);
      local_b0 = (xmlChar *)0x0;
    }
  }
  lVar32 = lVar32 + 1;
  pxVar25 = pxVar30->targets;
  bVar11 = lVar32 < pxVar25->nbItems;
  if (pxVar25->nbItems <= lVar32) goto LAB_001a8073;
  goto LAB_001a7d3b;
}

Assistant:

static int
xmlSchemaValidatorPopElem(xmlSchemaValidCtxtPtr vctxt)
{
    int ret = 0;
    xmlSchemaNodeInfoPtr inode = vctxt->inode;

    if (vctxt->nbAttrInfos != 0)
	xmlSchemaClearAttrInfos(vctxt);
    if (inode->flags & XML_SCHEMA_NODE_INFO_ERR_NOT_EXPECTED) {
	/*
	* This element was not expected;
	* we will not validate child elements of broken parents.
	* Skip validation of all content of the parent.
	*/
	vctxt->skipDepth = vctxt->depth -1;
	goto end_elem;
    }
    if ((inode->typeDef == NULL) ||
	(inode->flags & XML_SCHEMA_NODE_INFO_ERR_BAD_TYPE)) {
	/*
	* 1. the type definition might be missing if the element was
	*    error prone
	* 2. it might be abstract.
	*/
	goto end_elem;
    }
    /*
    * Check the content model.
    */
    if ((inode->typeDef->contentType == XML_SCHEMA_CONTENT_MIXED) ||
	(inode->typeDef->contentType == XML_SCHEMA_CONTENT_ELEMENTS)) {

	/*
	* Workaround for "anyType".
	*/
	if (inode->typeDef->builtInType == XML_SCHEMAS_ANYTYPE)
	    goto character_content;

	if ((inode->flags & XML_SCHEMA_ELEM_INFO_ERR_BAD_CONTENT) == 0) {
	    xmlChar *values[10];
	    int terminal, nbval = 10, nbneg;

	    if (inode->regexCtxt == NULL) {
		/*
		* Create the regex context.
		*/
		inode->regexCtxt =
		    xmlRegNewExecCtxt(inode->typeDef->contModel,
		    xmlSchemaVContentModelCallback, vctxt);
		if (inode->regexCtxt == NULL) {
		    VERROR_INT("xmlSchemaValidatorPopElem",
			"failed to create a regex context");
		    goto internal_error;
		}
	    }

	    /*
	     * Do not check further content if the node has been nilled
	     */
	    if (INODE_NILLED(inode)) {
		ret = 0;
                goto skip_nilled;
	    }

	    /*
	    * Get hold of the still expected content, since a further
	    * call to xmlRegExecPushString() will lose this information.
	    */
	    xmlRegExecNextValues(inode->regexCtxt,
		&nbval, &nbneg, &values[0], &terminal);
	    ret = xmlRegExecPushString(inode->regexCtxt, NULL, NULL);
	    if ((ret<0) || ((ret==0) && (!INODE_NILLED(inode)))) {
		/*
		* Still missing something.
		*/
		ret = 1;
		inode->flags |=
		    XML_SCHEMA_ELEM_INFO_ERR_BAD_CONTENT;
		xmlSchemaComplexTypeErr(ACTXT_CAST vctxt,
		    XML_SCHEMAV_ELEMENT_CONTENT, NULL, NULL,
		    "Missing child element(s)",
		    nbval, nbneg, values);
	    } else {
		/*
		* Content model is satisfied.
		*/
		ret = 0;
	    }

	}
    }

skip_nilled:

    if (inode->typeDef->contentType == XML_SCHEMA_CONTENT_ELEMENTS)
	goto end_elem;

character_content:

    if (vctxt->value != NULL) {
	xmlSchemaFreeValue(vctxt->value);
	vctxt->value = NULL;
    }
    /*
    * Check character content.
    */
    if (inode->decl == NULL) {
	/*
	* Speedup if no declaration exists.
	*/
	if (WXS_IS_SIMPLE(inode->typeDef)) {
	    ret = xmlSchemaVCheckINodeDataType(vctxt,
		inode, inode->typeDef, inode->value);
	} else if (WXS_HAS_SIMPLE_CONTENT(inode->typeDef)) {
	    ret = xmlSchemaVCheckINodeDataType(vctxt,
		inode, inode->typeDef->contentTypeDef,
		inode->value);
	}
	if (ret < 0) {
	    VERROR_INT("xmlSchemaValidatorPopElem",
		"calling xmlSchemaVCheckCVCSimpleType()");
	    goto internal_error;
	}
	goto end_elem;
    }
    /*
    * cvc-elt (3.3.4) : 5
    * The appropriate case among the following must be true:
    */
    /*
    * cvc-elt (3.3.4) : 5.1
    * If the declaration has a {value constraint},
    * the item has neither element nor character [children] and
    * clause 3.2 has not applied, then all of the following must be true:
    */
    if ((inode->decl->value != NULL) &&
	(inode->flags & XML_SCHEMA_ELEM_INFO_EMPTY) &&
	(! INODE_NILLED(inode))) {
	/*
	* cvc-elt (3.3.4) : 5.1.1
	* If the `actual type definition` is a `local type definition`
	* then the canonical lexical representation of the {value constraint}
	* value must be a valid default for the `actual type definition` as
	* defined in Element Default Valid (Immediate) ($3.3.6).
	*/
	/*
	* NOTE: 'local' above means types acquired by xsi:type.
	* NOTE: Although the *canonical* value is stated, it is not
	* relevant if canonical or not. Additionally XML Schema 1.1
	* will removed this requirement as well.
	*/
	if (inode->flags & XML_SCHEMA_ELEM_INFO_LOCAL_TYPE) {

	    ret = xmlSchemaCheckCOSValidDefault(vctxt,
		inode->decl->value, &(inode->val));
	    if (ret != 0) {
		if (ret < 0) {
		    VERROR_INT("xmlSchemaValidatorPopElem",
			"calling xmlSchemaCheckCOSValidDefault()");
		    goto internal_error;
		}
		goto end_elem;
	    }
	    /*
	    * Stop here, to avoid redundant validation of the value
	    * (see following).
	    */
	    goto default_psvi;
	}
	/*
	* cvc-elt (3.3.4) : 5.1.2
	* The element information item with the canonical lexical
	* representation of the {value constraint} value used as its
	* `normalized value` must be `valid` with respect to the
	* `actual type definition` as defined by Element Locally Valid (Type)
	* ($3.3.4).
	*/
	if (WXS_IS_SIMPLE(inode->typeDef)) {
	    ret = xmlSchemaVCheckINodeDataType(vctxt,
		inode, inode->typeDef, inode->decl->value);
	} else if (WXS_HAS_SIMPLE_CONTENT(inode->typeDef)) {
	    ret = xmlSchemaVCheckINodeDataType(vctxt,
		inode, inode->typeDef->contentTypeDef,
		inode->decl->value);
	}
	if (ret != 0) {
	    if (ret < 0) {
		VERROR_INT("xmlSchemaValidatorPopElem",
		    "calling xmlSchemaVCheckCVCSimpleType()");
		goto internal_error;
	    }
	    goto end_elem;
	}

default_psvi:
	/*
	* PSVI: Create a text node on the instance element.
	*/
	if ((vctxt->options & XML_SCHEMA_VAL_VC_I_CREATE) &&
	    (inode->node != NULL)) {
	    xmlNodePtr textChild;
	    xmlChar *normValue;
	    /*
	    * VAL TODO: Normalize the value.
	    */
	    normValue = xmlSchemaNormalizeValue(inode->typeDef,
		inode->decl->value);
	    if (normValue != NULL) {
		textChild = xmlNewDocText(inode->node->doc,
                        BAD_CAST normValue);
		xmlFree(normValue);
	    } else
		textChild = xmlNewDocText(inode->node->doc,
                        inode->decl->value);
	    if (textChild == NULL) {
		VERROR_INT("xmlSchemaValidatorPopElem",
		    "calling xmlNewDocText()");
		goto internal_error;
	    } else
		xmlAddChild(inode->node, textChild);
	}

    } else if (! INODE_NILLED(inode)) {
	/*
	* 5.2.1 The element information item must be `valid` with respect
	* to the `actual type definition` as defined by Element Locally
	* Valid (Type) ($3.3.4).
	*/
	if (WXS_IS_SIMPLE(inode->typeDef)) {
	     /*
	    * SPEC (cvc-type) (3.1)
	    * "If the type definition is a simple type definition, ..."
	    * (3.1.3) "If clause 3.2 of Element Locally Valid
	    * (Element) ($3.3.4) did not apply, then the `normalized value`
	    * must be `valid` with respect to the type definition as defined
	    * by String Valid ($3.14.4).
	    */
	    ret = xmlSchemaVCheckINodeDataType(vctxt,
		    inode, inode->typeDef, inode->value);
	} else if (WXS_HAS_SIMPLE_CONTENT(inode->typeDef)) {
	    /*
	    * SPEC (cvc-type) (3.2) "If the type definition is a complex type
	    * definition, then the element information item must be
	    * `valid` with respect to the type definition as per
	    * Element Locally Valid (Complex Type) ($3.4.4);"
	    *
	    * SPEC (cvc-complex-type) (2.2)
	    * "If the {content type} is a simple type definition, ...
	    * the `normalized value` of the element information item is
	    * `valid` with respect to that simple type definition as
	    * defined by String Valid ($3.14.4)."
	    */
	    ret = xmlSchemaVCheckINodeDataType(vctxt,
		inode, inode->typeDef->contentTypeDef, inode->value);
	}
	if (ret != 0) {
	    if (ret < 0) {
		VERROR_INT("xmlSchemaValidatorPopElem",
		    "calling xmlSchemaVCheckCVCSimpleType()");
		goto internal_error;
	    }
	    goto end_elem;
	}
	/*
	* 5.2.2 If there is a fixed {value constraint} and clause 3.2 has
	* not applied, all of the following must be true:
	*/
	if ((inode->decl->value != NULL) &&
	    (inode->decl->flags & XML_SCHEMAS_ELEM_FIXED)) {

	    /*
	    * TODO: We will need a computed value, when comparison is
	    * done on computed values.
	    */
	    /*
	    * 5.2.2.1 The element information item must have no element
	    * information item [children].
	    */
	    if (inode->flags &
		    XML_SCHEMA_ELEM_INFO_HAS_ELEM_CONTENT) {
		ret = XML_SCHEMAV_CVC_ELT_5_2_2_1;
		VERROR(ret, NULL,
		    "The content must not contain element nodes since "
		    "there is a fixed value constraint");
		goto end_elem;
	    } else {
		/*
		* 5.2.2.2 The appropriate case among the following must
		* be true:
		*/
		if (WXS_HAS_MIXED_CONTENT(inode->typeDef)) {
		    /*
		    * 5.2.2.2.1 If the {content type} of the `actual type
		    * definition` is mixed, then the *initial value* of the
		    * item must match the canonical lexical representation
		    * of the {value constraint} value.
		    *
		    * ... the *initial value* of an element information
		    * item is the string composed of, in order, the
		    * [character code] of each character information item in
		    * the [children] of that element information item.
		    */
		    if (! xmlStrEqual(inode->value, inode->decl->value)){
			/*
			* VAL TODO: Report invalid & expected values as well.
			* VAL TODO: Implement the canonical stuff.
			*/
			ret = XML_SCHEMAV_CVC_ELT_5_2_2_2_1;
			xmlSchemaCustomErr(ACTXT_CAST vctxt,
			    ret, NULL, NULL,
			    "The initial value '%s' does not match the fixed "
			    "value constraint '%s'",
			    inode->value, inode->decl->value);
			goto end_elem;
		    }
		} else if (WXS_HAS_SIMPLE_CONTENT(inode->typeDef)) {
		    /*
		    * 5.2.2.2.2 If the {content type} of the `actual type
		    * definition` is a simple type definition, then the
		    * *actual value* of the item must match the canonical
		    * lexical representation of the {value constraint} value.
		    */
		    /*
		    * VAL TODO: *actual value* is the normalized value, impl.
		    *           this.
		    * VAL TODO: Report invalid & expected values as well.
		    * VAL TODO: Implement a comparison with the computed values.
		    */
		    if (! xmlStrEqual(inode->value,
			    inode->decl->value)) {
			ret = XML_SCHEMAV_CVC_ELT_5_2_2_2_2;
			xmlSchemaCustomErr(ACTXT_CAST vctxt,
			    ret, NULL, NULL,
			    "The actual value '%s' does not match the fixed "
			    "value constraint '%s'",
			    inode->value,
			    inode->decl->value);
			goto end_elem;
		    }
		}
	    }
	}
    }

end_elem:
    if (vctxt->depth < 0) {
	/* TODO: raise error? */
	return (0);
    }
    if (vctxt->depth == vctxt->skipDepth)
	vctxt->skipDepth = -1;
    /*
    * Evaluate the history of XPath state objects.
    */
    if (inode->appliedXPath &&
	(xmlSchemaXPathProcessHistory(vctxt, vctxt->depth) == -1))
	goto internal_error;
    /*
    * MAYBE TODO:
    * SPEC (6) "The element information item must be `valid` with
    * respect to each of the {identity-constraint definitions} as per
    * Identity-constraint Satisfied ($3.11.4)."
    */
    /*
    * PSVI TODO: If we expose IDC node-tables via PSVI then the tables
    *   need to be built in any case.
    *   We will currently build IDC node-tables and bubble them only if
    *   keyrefs do exist.
    */

    /*
    * Add the current IDC target-nodes to the IDC node-tables.
    */
    if ((inode->idcMatchers != NULL) &&
	(vctxt->hasKeyrefs || vctxt->createIDCNodeTables))
    {
	if (xmlSchemaIDCFillNodeTables(vctxt, inode) == -1)
	    goto internal_error;
    }
    /*
    * Validate IDC keyrefs.
    */
    if (vctxt->inode->hasKeyrefs)
	if (xmlSchemaCheckCVCIDCKeyRef(vctxt) == -1)
	    goto internal_error;
    /*
    * Merge/free the IDC table.
    */
    if (inode->idcTable != NULL) {
	if ((vctxt->depth > 0) &&
	    (vctxt->hasKeyrefs || vctxt->createIDCNodeTables))
	{
	    /*
	    * Merge the IDC node table with the table of the parent node.
	    */
	    if (xmlSchemaBubbleIDCNodeTables(vctxt) == -1)
		goto internal_error;
	}
    }
    /*
    * Clear the current ielem.
    * VAL TODO: Don't free the PSVI IDC tables if they are
    * requested for the PSVI.
    */
    xmlSchemaClearElemInfo(vctxt, inode);
    /*
    * Skip further processing if we are on the validation root.
    */
    if (vctxt->depth == 0) {
	vctxt->depth--;
	vctxt->inode = NULL;
	return (0);
    }
    /*
    * Reset the keyrefDepth if needed.
    */
    if (vctxt->aidcs != NULL) {
	xmlSchemaIDCAugPtr aidc = vctxt->aidcs;
	do {
	    if (aidc->keyrefDepth == vctxt->depth) {
		/*
		* A 'keyrefDepth' of a key/unique IDC matches the current
		* depth, this means that we are leaving the scope of the
		* top-most keyref IDC which refers to this IDC.
		*/
		aidc->keyrefDepth = -1;
	    }
	    aidc = aidc->next;
	} while (aidc != NULL);
    }
    vctxt->depth--;
    vctxt->inode = vctxt->elemInfos[vctxt->depth];
    /*
    * VAL TODO: 7 If the element information item is the `validation root`, it must be
    * `valid` per Validation Root Valid (ID/IDREF) ($3.3.4).
    */
    return (ret);

internal_error:
    vctxt->err = -1;
    return (-1);
}